

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryLayeredRenderingTests.cpp
# Opt level: O0

bool vkt::geometry::anon_unknown_0::verifyImageSingleColoredRow
               (TestLog *log,ConstPixelBufferAccess *image,float rowWidthRatio,Vec4 *barColor)

{
  void **this;
  float fVar1;
  int iVar2;
  int height;
  TextureFormat *format;
  MessageBuilder *pMVar3;
  TestLog *pTVar4;
  bool bVar5;
  byte local_a03;
  ConstPixelBufferAccess local_998;
  allocator<char> local_969;
  string local_968;
  allocator<char> local_941;
  string local_940;
  LogImage local_920;
  allocator<char> local_889;
  string local_888;
  allocator<char> local_861;
  string local_860;
  LogImage local_840;
  allocator<char> local_7a9;
  string local_7a8;
  allocator<char> local_781;
  string local_780;
  LogImageSet local_760;
  MessageBuilder local_720;
  undefined4 local_5a0;
  allocator<char> local_599;
  string local_598;
  allocator<char> local_571;
  string local_570;
  LogImage local_550;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  LogImageSet local_470;
  MessageBuilder local_430;
  bool local_2ab;
  undefined1 local_2aa;
  byte local_2a9;
  undefined1 local_2a8 [5];
  bool isOk;
  bool isColor;
  bool isBlack;
  Vec4 color;
  int x;
  int y;
  bool allPixelsOk;
  MessageBuilder local_280;
  PixelBufferAccess local_100;
  undefined1 local_c8 [8];
  PixelBufferAccess errorMaskAccess;
  TextureLevel errorMask;
  int barLengthThreshold;
  int barLength;
  Vec4 threshold;
  Vec4 red;
  Vec4 green;
  Vec4 black;
  Vec4 *barColor_local;
  float rowWidthRatio_local;
  ConstPixelBufferAccess *image_local;
  TestLog *log_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(green.m_data + 2),0.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(red.m_data + 2),0.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(threshold.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&barLengthThreshold,0.02);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(image);
  errorMask.m_data.m_cap._4_4_ = (int)(rowWidthRatio * (float)iVar2);
  errorMask.m_data.m_cap._0_4_ = 1;
  format = tcu::ConstPixelBufferAccess::getFormat(image);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(image);
  height = tcu::ConstPixelBufferAccess::getHeight(image);
  this = &errorMaskAccess.super_ConstPixelBufferAccess.m_data;
  tcu::TextureLevel::TextureLevel((TextureLevel *)this,format,iVar2,height,1);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_c8,(TextureLevel *)this);
  tcu::TextureLevel::getAccess
            (&local_100,(TextureLevel *)&errorMaskAccess.super_ConstPixelBufferAccess.m_data);
  tcu::clear(&local_100,(Vec4 *)(red.m_data + 2));
  tcu::TestLog::operator<<(&local_280,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (&local_280,
                      (char (*) [61])"Expecting all pixels with distance less or equal to (about) ")
  ;
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)((long)&errorMask.m_data.m_cap + 4));
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [41])" pixels from left border to be of color ");
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&y,(int)barColor,0,1);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(Vector<float,_3> *)&y);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x134232e);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_280);
  bVar5 = true;
  for (color.m_data[3] = 0.0; fVar1 = color.m_data[3],
      iVar2 = tcu::ConstPixelBufferAccess::getHeight(image), (int)fVar1 < iVar2;
      color.m_data[3] = (float)((int)color.m_data[3] + 1)) {
    for (color.m_data[2] = 0.0; fVar1 = color.m_data[2],
        iVar2 = tcu::ConstPixelBufferAccess::getWidth(image), (int)fVar1 < iVar2;
        color.m_data[2] = (float)((int)color.m_data[2] + 1)) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_2a8,(int)image,(int)color.m_data[2],
                 (int)color.m_data[3]);
      local_2a9 = compareColors((Vec4 *)local_2a8,(Vec4 *)(green.m_data + 2),
                                (Vec4 *)&barLengthThreshold);
      local_2aa = compareColors((Vec4 *)local_2a8,barColor,(Vec4 *)&barLengthThreshold);
      local_2ab = (bool)local_2aa;
      if (errorMask.m_data.m_cap._4_4_ + -1 < (int)color.m_data[2]) {
        local_a03 = local_2a9;
        if (((int)color.m_data[2] < errorMask.m_data.m_cap._4_4_ + 1) &&
           (local_a03 = 1, !(bool)local_2aa)) {
          local_a03 = local_2a9;
        }
        local_2ab = (bool)(local_a03 & 1);
      }
      bVar5 = (bVar5 & local_2ab) != 0;
      if (local_2ab == false) {
        tcu::PixelBufferAccess::setPixel
                  ((PixelBufferAccess *)local_c8,(Vec4 *)(threshold.m_data + 2),(int)color.m_data[2]
                   ,(int)color.m_data[3],0);
      }
    }
  }
  if (bVar5 == false) {
    tcu::TestLog::operator<<(&local_720,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_720,
                        (char (*) [50])"Image verification failed. Got unexpected pixels.");
    pTVar4 = tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_780,"LayerContent",&local_781);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7a8,"Layer content",&local_7a9);
    tcu::LogImageSet::LogImageSet(&local_760,&local_780,&local_7a8);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_760);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_860,"Layer",&local_861);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_888,"Layer",&local_889);
    tcu::LogImage::LogImage(&local_840,&local_860,&local_888,image,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_840);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_940,"ErrorMask",&local_941);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_968,"Errors",&local_969);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&local_998,(TextureLevel *)&errorMaskAccess.super_ConstPixelBufferAccess.m_data);
    tcu::LogImage::LogImage
              (&local_920,&local_940,&local_968,&local_998,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_920);
    tcu::TestLog::operator<<(pTVar4,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_920);
    std::__cxx11::string::~string((string *)&local_968);
    std::allocator<char>::~allocator(&local_969);
    std::__cxx11::string::~string((string *)&local_940);
    std::allocator<char>::~allocator(&local_941);
    tcu::LogImage::~LogImage(&local_840);
    std::__cxx11::string::~string((string *)&local_888);
    std::allocator<char>::~allocator(&local_889);
    std::__cxx11::string::~string((string *)&local_860);
    std::allocator<char>::~allocator(&local_861);
    tcu::LogImageSet::~LogImageSet(&local_760);
    std::__cxx11::string::~string((string *)&local_7a8);
    std::allocator<char>::~allocator(&local_7a9);
    std::__cxx11::string::~string((string *)&local_780);
    std::allocator<char>::~allocator(&local_781);
    tcu::MessageBuilder::~MessageBuilder(&local_720);
  }
  else {
    tcu::TestLog::operator<<(&local_430,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_430,(char (*) [16])"Image is valid.");
    pTVar4 = tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_490,"LayerContent",&local_491);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b8,"Layer content",&local_4b9);
    tcu::LogImageSet::LogImageSet(&local_470,&local_490,&local_4b8);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_470);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"Layer",&local_571);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_598,"Layer",&local_599);
    tcu::LogImage::LogImage(&local_550,&local_570,&local_598,image,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_550);
    tcu::TestLog::operator<<(pTVar4,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_550);
    std::__cxx11::string::~string((string *)&local_598);
    std::allocator<char>::~allocator(&local_599);
    std::__cxx11::string::~string((string *)&local_570);
    std::allocator<char>::~allocator(&local_571);
    tcu::LogImageSet::~LogImageSet(&local_470);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator(&local_4b9);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator(&local_491);
    tcu::MessageBuilder::~MessageBuilder(&local_430);
  }
  log_local._7_1_ = bVar5 != false;
  local_5a0 = 1;
  tcu::TextureLevel::~TextureLevel
            ((TextureLevel *)&errorMaskAccess.super_ConstPixelBufferAccess.m_data);
  return log_local._7_1_;
}

Assistant:

bool verifyImageSingleColoredRow (tcu::TestLog& log, const tcu::ConstPixelBufferAccess image, const float rowWidthRatio, const tcu::Vec4& barColor)
{
	DE_ASSERT(rowWidthRatio > 0.0f);

	const Vec4				black				(0.0f, 0.0f, 0.0f, 1.0f);
	const Vec4				green				(0.0f, 1.0f, 0.0f, 1.0f);
	const Vec4				red					(1.0f, 0.0f, 0.0f, 1.0f);
	const Vec4				threshold			(0.02f);
	const int				barLength			= static_cast<int>(rowWidthRatio * static_cast<float>(image.getWidth()));
	const int				barLengthThreshold	= 1;
	tcu::TextureLevel		errorMask			(image.getFormat(), image.getWidth(), image.getHeight());
	tcu::PixelBufferAccess	errorMaskAccess		= errorMask.getAccess();

	tcu::clear(errorMask.getAccess(), green);

	log << tcu::TestLog::Message
		<< "Expecting all pixels with distance less or equal to (about) " << barLength
		<< " pixels from left border to be of color " << barColor.swizzle(0, 1, 2) << "."
		<< tcu::TestLog::EndMessage;

	bool allPixelsOk = true;

	for (int y = 0; y < image.getHeight(); ++y)
	for (int x = 0; x < image.getWidth();  ++x)
	{
		const Vec4	color		= image.getPixel(x, y);
		const bool	isBlack		= compareColors(color, black, threshold);
		const bool	isColor		= compareColors(color, barColor, threshold);

		bool isOk;

		if (x <= barLength - barLengthThreshold)
			isOk = isColor;
		else if (x >= barLength + barLengthThreshold)
			isOk = isBlack;
		else
			isOk = isColor || isBlack;

		allPixelsOk &= isOk;

		if (!isOk)
			errorMaskAccess.setPixel(red, x, y);
	}

	if (allPixelsOk)
	{
		log << tcu::TestLog::Message << "Image is valid." << tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
			<< tcu::TestLog::Image("Layer", "Layer", image)
			<< tcu::TestLog::EndImageSet;
		return true;
	}
	else
	{
		log << tcu::TestLog::Message << "Image verification failed. Got unexpected pixels." << tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
			<< tcu::TestLog::Image("Layer",		"Layer",	image)
			<< tcu::TestLog::Image("ErrorMask",	"Errors",	errorMask)
			<< tcu::TestLog::EndImageSet;
		return false;
	}

	log << tcu::TestLog::Image("LayerContent", "Layer content", image);

	return allPixelsOk;
}